

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaction.cpp
# Opt level: O0

QString * qt_strippedText(QString *s)

{
  bool bVar1;
  QString *this;
  qsizetype qVar2;
  QString *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar3;
  int i;
  QString *this_00;
  int local_34;
  QChar local_c;
  char16_t local_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  QVar3 = Qt::Literals::StringLiterals::operator____L1((char *)in_RDI,(size_t)in_RDI);
  QString::remove((QLatin1String *)in_RSI,(CaseSensitivity)QVar3.m_size);
  local_34 = 0;
  while( true ) {
    this = (QString *)(long)local_34;
    qVar2 = QString::size(in_RSI);
    if (qVar2 <= (long)this) break;
    local_a = (char16_t)QString::at(this_00,(qsizetype)in_RDI);
    QChar::QChar<char16_t,_true>(&local_c,L'&');
    bVar1 = operator==((QChar *)in_RDI,(QChar *)this);
    if (bVar1) {
      QString::remove((longlong)in_RSI,(long)local_34);
    }
    local_34 = local_34 + 1;
  }
  QString::trimmed(this);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return this_00;
}

Assistant:

static QString qt_strippedText(QString s)
{
    s.remove("..."_L1);
    for (int i = 0; i < s.size(); ++i) {
        if (s.at(i) == u'&')
            s.remove(i, 1);
    }
    return s.trimmed();
}